

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_decoder.h
# Opt level: O3

bool __thiscall
draco::MeshEdgebreakerTraversalDecoder::DecodeStartFaces(MeshEdgebreakerTraversalDecoder *this)

{
  long lVar1;
  char *pcVar2;
  int64_t iVar3;
  int64_t iVar4;
  uint8_t *puVar5;
  size_t sVar6;
  undefined1 uVar7;
  uint16_t uVar8;
  bool bVar9;
  ulong in_RAX;
  uint64_t traversal_size;
  ulong local_18;
  
  if (0x201 < (this->buffer_).bitstream_version_) {
    bVar9 = RAnsBitDecoder::StartDecoding(&this->start_face_decoder_,&this->buffer_);
    return bVar9;
  }
  uVar7 = (this->buffer_).field_0x31;
  uVar8 = (this->buffer_).bitstream_version_;
  (this->start_face_buffer_).bit_mode_ = (this->buffer_).bit_mode_;
  (this->start_face_buffer_).field_0x31 = uVar7;
  (this->start_face_buffer_).bitstream_version_ = uVar8;
  pcVar2 = (this->buffer_).data_;
  iVar3 = (this->buffer_).data_size_;
  iVar4 = (this->buffer_).pos_;
  puVar5 = (this->buffer_).bit_decoder_.bit_buffer_;
  sVar6 = (this->buffer_).bit_decoder_.bit_offset_;
  (this->start_face_buffer_).bit_decoder_.bit_buffer_end_ =
       (this->buffer_).bit_decoder_.bit_buffer_end_;
  (this->start_face_buffer_).bit_decoder_.bit_offset_ = sVar6;
  (this->start_face_buffer_).pos_ = iVar4;
  (this->start_face_buffer_).bit_decoder_.bit_buffer_ = puVar5;
  (this->start_face_buffer_).data_ = pcVar2;
  (this->start_face_buffer_).data_size_ = iVar3;
  local_18 = in_RAX;
  bVar9 = DecoderBuffer::StartBitDecoding(&this->start_face_buffer_,true,&local_18);
  if (bVar9) {
    uVar7 = (this->start_face_buffer_).field_0x31;
    uVar8 = (this->start_face_buffer_).bitstream_version_;
    (this->buffer_).bit_mode_ = (this->start_face_buffer_).bit_mode_;
    (this->buffer_).field_0x31 = uVar7;
    (this->buffer_).bitstream_version_ = uVar8;
    pcVar2 = (this->start_face_buffer_).data_;
    iVar3 = (this->start_face_buffer_).data_size_;
    iVar4 = (this->start_face_buffer_).pos_;
    puVar5 = (this->start_face_buffer_).bit_decoder_.bit_buffer_;
    sVar6 = (this->start_face_buffer_).bit_decoder_.bit_offset_;
    (this->buffer_).bit_decoder_.bit_buffer_end_ =
         (this->start_face_buffer_).bit_decoder_.bit_buffer_end_;
    (this->buffer_).bit_decoder_.bit_offset_ = sVar6;
    (this->buffer_).pos_ = iVar4;
    (this->buffer_).bit_decoder_.bit_buffer_ = puVar5;
    (this->buffer_).data_ = pcVar2;
    (this->buffer_).data_size_ = iVar3;
    lVar1 = (this->buffer_).pos_;
    if (local_18 <= (ulong)((this->buffer_).data_size_ - lVar1)) {
      (this->buffer_).pos_ = lVar1 + local_18;
      return true;
    }
  }
  return false;
}

Assistant:

bool DecodeStartFaces() {
    // Create a decoder that is set to the end of the encoded traversal data.
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
    if (buffer_.bitstream_version() < DRACO_BITSTREAM_VERSION(2, 2)) {
      start_face_buffer_ = buffer_;
      uint64_t traversal_size;
      if (!start_face_buffer_.StartBitDecoding(true, &traversal_size)) {
        return false;
      }
      buffer_ = start_face_buffer_;
      if (traversal_size > static_cast<uint64_t>(buffer_.remaining_size())) {
        return false;
      }
      buffer_.Advance(traversal_size);
      return true;
    }
#endif
    return start_face_decoder_.StartDecoding(&buffer_);
  }